

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,VariableExpression *expression)

{
  bool bVar1;
  unordered_map<Symbol,_int,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_int>_>_>
  *this_00;
  mapped_type *pmVar2;
  bool bVar3;
  string local_b8;
  Symbol local_98;
  NewScopeLayer *local_78;
  NewScopeLayer *current;
  string local_60;
  Symbol local_40;
  Symbol *local_20;
  Symbol *symbol;
  VariableExpression *expression_local;
  TypeCheckingVisitor *this_local;
  
  symbol = (Symbol *)expression;
  expression_local = (VariableExpression *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_20 = &local_40;
  local_78 = this->current_layer_;
  while( true ) {
    bVar1 = NewScopeLayer::HasArray(local_78,local_20);
    bVar3 = false;
    if (!bVar1) {
      bVar1 = NewScopeLayer::HasVariable(local_78,local_20);
      bVar3 = false;
      if (!bVar1) {
        bVar3 = local_78->parent_->parent_ != (NewScopeLayer *)0x0;
      }
    }
    if (!bVar3) break;
    local_78 = local_78->parent_;
  }
  this_00 = &local_78->symbol_types_;
  std::__cxx11::string::string((string *)&local_b8,(string *)&(symbol->name_)._M_string_length);
  Symbol::Symbol(&local_98,&local_b8);
  pmVar2 = std::
           unordered_map<Symbol,_int,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_int>_>_>
           ::operator[](this_00,&local_98);
  (this->super_TemplateVisitor<int>).tos_value_ = *pmVar2;
  Symbol::~Symbol(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  Symbol::~Symbol(&local_40);
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(VariableExpression* expression) {
  // can be arr or var
  const Symbol& symbol = Symbol(expression->variable_name_);
  NewScopeLayer* current = current_layer_;

  while (!current->HasArray(symbol) && !current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  tos_value_ = current->symbol_types_[Symbol(expression->variable_name_)];
}